

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

pos_type __thiscall
lrit::anon_unknown_0::membuf::seekoff(membuf *this,off_type off,seekdir dir,openmode which)

{
  long lVar1;
  pos_type pVar2;
  
  if (dir == _S_beg) {
    lVar1 = off + *(long *)&this->field_0x8;
  }
  else if (dir == _S_cur) {
    lVar1 = (long)(int)off + *(long *)&this->field_0x10;
  }
  else {
    if (dir != _S_end) {
      lVar1 = *(long *)&this->field_0x10;
      goto LAB_0010d16f;
    }
    lVar1 = off + *(long *)&this->field_0x18;
  }
  *(long *)&this->field_0x10 = lVar1;
LAB_0010d16f:
  pVar2._M_off = lVar1 - *(long *)&this->field_0x8;
  pVar2._M_state.__count = 0;
  pVar2._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  return pVar2;
}

Assistant:

pos_type seekoff(
      off_type off,
      std::ios_base::seekdir dir,
      std::ios_base::openmode which = std::ios_base::in) override {
    if (dir == std::ios_base::cur) {
      gbump(off);
    } else if (dir == std::ios_base::end) {
      setg(eback(), egptr() + off, egptr());
    } else if (dir == std::ios_base::beg) {
      setg(eback(), eback() + off, egptr());
    }
    return gptr() - eback();
  }